

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O2

void __thiscall RVO::RVOSimulator::~RVOSimulator(RVOSimulator *this)

{
  Agent *pAVar1;
  pointer ppAVar2;
  pointer ppOVar3;
  KdTree *this_00;
  size_t i_1;
  size_t i;
  ulong uVar4;
  
  pAVar1 = this->defaultAgent_;
  if (pAVar1 != (Agent *)0x0) {
    Agent::~Agent(pAVar1);
    operator_delete(pAVar1,0x98);
  }
  for (uVar4 = 0;
      ppAVar2 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->agents_).
                            super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppAVar2 >> 3);
      uVar4 = uVar4 + 1) {
    pAVar1 = ppAVar2[uVar4];
    if (pAVar1 != (Agent *)0x0) {
      Agent::~Agent(pAVar1);
    }
    operator_delete(pAVar1,0x98);
  }
  for (uVar4 = 0;
      ppOVar3 = (this->obstacles_).
                super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->obstacles_).
                            super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppOVar3 >> 3);
      uVar4 = uVar4 + 1) {
    operator_delete(ppOVar3[uVar4],0x30);
  }
  this_00 = this->kdTree_;
  if (this_00 != (KdTree *)0x0) {
    KdTree::~KdTree(this_00);
  }
  operator_delete(this_00,0x40);
  std::_Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>::~_Vector_base
            (&(this->obstacles_).
              super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>);
  std::_Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>::~_Vector_base
            ((_Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_> *)this);
  return;
}

Assistant:

RVOSimulator::~RVOSimulator()
	{
		if (defaultAgent_ != NULL) {
			delete defaultAgent_;
		}

		for (size_t i = 0; i < agents_.size(); ++i) {
			delete agents_[i];
		}

		for (size_t i = 0; i < obstacles_.size(); ++i) {
			delete obstacles_[i];
		}

		delete kdTree_;
	}